

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_greedy_dictMatchState_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  uint uVar4;
  char cVar5;
  undefined8 uVar6;
  seqStore_t *psVar7;
  uint uVar8;
  seqDef *psVar9;
  size_t sVar10;
  uint uVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  long lVar14;
  int *ip;
  uint uVar15;
  int *piVar16;
  uint uVar17;
  U32 UVar18;
  ulong uVar19;
  ulong uVar20;
  BYTE *litEnd_1;
  ulong uVar21;
  uint uVar22;
  BYTE *litEnd;
  U32 local_b0;
  U32 local_ac;
  int local_a8;
  size_t offbaseFound;
  ulong local_90;
  uint local_84;
  seqStore_t *local_80;
  BYTE *local_78;
  ulong local_70;
  int *local_68;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *litLimit_w;
  BYTE *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  pBVar2 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  local_90 = (ulong)uVar8;
  local_78 = pBVar2 + local_90;
  uVar15 = (ms->cParams).minMatch;
  if (5 < uVar15) {
    uVar15 = 6;
  }
  if (uVar15 < 5) {
    uVar15 = 4;
  }
  local_84 = (ms->cParams).searchLog;
  uVar22 = 6;
  if (local_84 < 6) {
    uVar22 = local_84;
  }
  if (uVar22 < 5) {
    uVar22 = 4;
  }
  pZVar3 = ms->dictMatchState;
  local_48 = (pZVar3->window).base;
  local_40 = local_48 + (pZVar3->window).dictLimit;
  local_60 = (pZVar3->window).nextSrc;
  local_ac = *rep;
  local_b0 = rep[1];
  ms->lazySkipping = 0;
  local_68 = (int *)((long)src + (srcSize - 0x10));
  uVar17 = ms->nextToUpdate;
  uVar21 = (ulong)uVar17;
  uVar11 = ((int)local_68 - (int)(pBVar2 + uVar21)) + 1;
  if (7 < uVar11) {
    uVar11 = 8;
  }
  uVar4 = 0;
  if (pBVar2 + uVar21 <= local_68) {
    uVar4 = uVar11;
  }
  cVar5 = (char)ms->rowHashLog;
  iEnd = (BYTE *)((long)src + srcSize);
  for (; uVar21 < uVar4 + uVar17; uVar21 = uVar21 + 1) {
    if (uVar15 == 5) {
      uVar19 = *(long *)(pBVar2 + uVar21) * -0x30e4432345000000;
LAB_00f3ce2a:
      UVar18 = (U32)((uVar19 ^ ms->hashSalt) >> (0x38U - cVar5 & 0x3f));
    }
    else {
      if (uVar15 == 6) {
        uVar19 = *(long *)(pBVar2 + uVar21) * -0x30e4432340650000;
        goto LAB_00f3ce2a;
      }
      UVar18 = (*(int *)(pBVar2 + uVar21) * -0x61c8864f ^ (uint)ms->hashSalt) >>
               (0x18U - cVar5 & 0x1f);
    }
    ms->hashCache[(uint)uVar21 & 7] = UVar18;
  }
  local_70 = (ulong)(((int)local_48 - (int)local_60) + uVar8);
  ip = (int *)((ulong)(((int)src - ((int)local_78 + (int)local_40)) + (int)local_60 == 0) +
              (long)src);
  local_58 = local_48 + -local_70;
  litLimit_w = iEnd + -0x20;
  local_80 = seqStore;
  local_38 = rep;
LAB_00f3cee4:
  do {
    if (local_68 <= ip) {
      *local_38 = local_ac;
      local_38[1] = local_b0;
      return (long)iEnd - (long)src;
    }
    local_a8 = (int)pBVar2;
    uVar8 = (((int)ip - local_a8) - local_ac) + 1;
    uVar17 = (uint)local_90;
    if (uVar8 - uVar17 < 0xfffffffd) {
      piVar16 = (int *)(pBVar2 + uVar8);
      if (uVar8 < uVar17) {
        piVar16 = (int *)(local_48 + (uVar8 - (int)local_70));
      }
      if (*piVar16 != *(int *)((long)ip + 1)) goto LAB_00f3cf2c;
      pBVar13 = iEnd;
      if (uVar8 < uVar17) {
        pBVar13 = local_60;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),(BYTE *)(piVar16 + 1),iEnd,pBVar13,local_78);
      uVar21 = sVar10 + 4;
      sVar10 = 1;
      ip = (int *)((long)ip + 1);
    }
    else {
LAB_00f3cf2c:
      offbaseFound = 999999999;
      if (uVar15 == 6) {
        if (uVar22 == 6) {
          uVar21 = ZSTD_RowFindBestMatch_dictMatchState_6_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else if (uVar22 == 5) {
          uVar21 = ZSTD_RowFindBestMatch_dictMatchState_6_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else {
          uVar21 = ZSTD_RowFindBestMatch_dictMatchState_6_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
      }
      else if (uVar15 == 5) {
        if (uVar22 == 6) {
          uVar21 = ZSTD_RowFindBestMatch_dictMatchState_5_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else if (uVar22 == 5) {
          uVar21 = ZSTD_RowFindBestMatch_dictMatchState_5_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
        else {
          uVar21 = ZSTD_RowFindBestMatch_dictMatchState_5_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
        }
      }
      else if (uVar22 == 6) {
        uVar21 = ZSTD_RowFindBestMatch_dictMatchState_4_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else if (uVar22 == 5) {
        uVar21 = ZSTD_RowFindBestMatch_dictMatchState_4_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else {
        uVar21 = ZSTD_RowFindBestMatch_dictMatchState_4_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      if (uVar21 < 4) {
        uVar21 = (long)ip - (long)src;
        ip = (int *)((long)ip + (uVar21 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar21);
        goto LAB_00f3cee4;
      }
      sVar10 = offbaseFound;
      if (3 < offbaseFound) {
        uVar19 = (long)ip + (-(long)pBVar2 - offbaseFound) + -0xfffffffd;
        pBVar12 = pBVar2;
        pBVar13 = local_78;
        if ((uint)uVar19 < (uint)local_90) {
          pBVar12 = local_58;
          pBVar13 = local_40;
        }
        pBVar12 = pBVar12 + (uVar19 & 0xffffffff);
        for (; ((src < ip && (pBVar13 < pBVar12)) && (*(BYTE *)((long)ip + -1) == pBVar12[-1]));
            ip = (int *)((long)ip + -1)) {
          pBVar12 = pBVar12 + -1;
          uVar21 = uVar21 + 1;
        }
        local_b0 = local_ac;
        local_ac = (int)offbaseFound - 3;
      }
    }
    uVar19 = (long)ip - (long)src;
    pBVar13 = local_80->lit;
    if (litLimit_w < ip) {
      ZSTD_safecopyLiterals(pBVar13,(BYTE *)src,(BYTE *)ip,litLimit_w);
LAB_00f3d110:
      local_80->lit = local_80->lit + uVar19;
      psVar9 = local_80->sequences;
      if (0xffff < uVar19) {
        local_80->longLengthType = ZSTD_llt_literalLength;
        local_80->longLengthPos = (U32)((ulong)((long)psVar9 - (long)local_80->sequencesStart) >> 3)
        ;
      }
    }
    else {
      uVar6 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar13 = *src;
      *(undefined8 *)(pBVar13 + 8) = uVar6;
      pBVar13 = local_80->lit;
      if (0x10 < uVar19) {
        uVar6 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar13 + 0x18) = uVar6;
        if (0x20 < (long)uVar19) {
          lVar14 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar14 + 0x20);
            uVar6 = puVar1[1];
            pBVar12 = pBVar13 + lVar14 + 0x20;
            *(undefined8 *)pBVar12 = *puVar1;
            *(undefined8 *)(pBVar12 + 8) = uVar6;
            puVar1 = (undefined8 *)((long)src + lVar14 + 0x30);
            uVar6 = puVar1[1];
            *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar12 + 0x18) = uVar6;
            lVar14 = lVar14 + 0x20;
          } while (pBVar12 + 0x20 < pBVar13 + uVar19);
        }
        goto LAB_00f3d110;
      }
      local_80->lit = pBVar13 + uVar19;
      psVar9 = local_80->sequences;
    }
    psVar7 = local_80;
    psVar9->litLength = (U16)uVar19;
    psVar9->offBase = (U32)sVar10;
    if (0xffff < uVar21 - 3) {
      local_80->longLengthType = ZSTD_llt_matchLength;
      local_80->longLengthPos = (U32)((ulong)((long)psVar9 - (long)local_80->sequencesStart) >> 3);
    }
    psVar9->mlBase = (U16)(uVar21 - 3);
    local_80->sequences = psVar9 + 1;
    if (ms->lazySkipping != 0) {
      uVar8 = ms->nextToUpdate;
      uVar19 = (ulong)uVar8;
      uVar17 = ((int)local_68 - (int)(pBVar2 + uVar19)) + 1;
      if (7 < uVar17) {
        uVar17 = 8;
      }
      if (local_68 < pBVar2 + uVar19) {
        uVar17 = 0;
      }
      cVar5 = (char)ms->rowHashLog;
      for (; uVar19 < uVar17 + uVar8; uVar19 = uVar19 + 1) {
        if (uVar15 == 5) {
          uVar20 = *(long *)(pBVar2 + uVar19) * -0x30e4432345000000;
LAB_00f3d295:
          UVar18 = (U32)((uVar20 ^ ms->hashSalt) >> (0x38U - cVar5 & 0x3f));
        }
        else {
          if (uVar15 == 6) {
            uVar20 = *(long *)(pBVar2 + uVar19) * -0x30e4432340650000;
            goto LAB_00f3d295;
          }
          UVar18 = (*(int *)(pBVar2 + uVar19) * -0x61c8864f ^ (uint)ms->hashSalt) >>
                   (0x18U - cVar5 & 0x1f);
        }
        ms->hashCache[(uint)uVar19 & 7] = UVar18;
      }
      ms->lazySkipping = 0;
    }
    UVar18 = local_b0;
    for (ip = (int *)((long)ip + uVar21); local_b0 = UVar18, src = ip, ip <= local_68;
        ip = (int *)((long)ip + sVar10 + 4)) {
      uVar8 = ((int)ip - local_a8) - local_b0;
      uVar17 = (uint)local_90;
      pBVar13 = pBVar2;
      if (uVar8 < uVar17) {
        pBVar13 = local_58;
      }
      if ((0xfffffffc < uVar8 - uVar17) || (*(int *)(pBVar13 + uVar8) != *ip)) break;
      pBVar12 = iEnd;
      if (uVar8 < uVar17) {
        pBVar12 = local_60;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar13 + uVar8) + 4),iEnd,pBVar12,
                          local_78);
      pBVar13 = psVar7->lit;
      if (litLimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar13,(BYTE *)ip,(BYTE *)ip,litLimit_w);
      }
      else {
        uVar6 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar13 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar13 + 8) = uVar6;
      }
      psVar9 = psVar7->sequences;
      psVar9->litLength = 0;
      psVar9->offBase = 1;
      if (0xffff < sVar10 + 1) {
        psVar7->longLengthType = ZSTD_llt_matchLength;
        psVar7->longLengthPos = (U32)((ulong)((long)psVar9 - (long)psVar7->sequencesStart) >> 3);
      }
      psVar9->mlBase = (U16)(sVar10 + 1);
      psVar7->sequences = psVar9 + 1;
      UVar18 = local_ac;
      local_ac = local_b0;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_dictMatchState);
}